

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O3

bool __thiscall GameBoard::winConditionSatisfied(GameBoard *this)

{
  QArrayData *pQVar1;
  int iVar2;
  int iVar3;
  reference pQVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  QChar *pQVar8;
  QVector<QVector<Field_*>_> *pQVar9;
  int iVar10;
  long lVar11;
  ulong i;
  long lVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QString symbol;
  QArrayData *local_78;
  QChar *pQStack_70;
  longlong lStack_68;
  QArrayData *local_58;
  QChar *pQStack_50;
  long local_48;
  
  pQVar1 = local_78;
  iVar3 = this->width_;
  lVar6 = (long)iVar3;
  if (0 < lVar6) {
    pQVar9 = &this->grid_;
    lVar12 = 0;
    do {
      pQVar4 = QList<QList<Field_*>_>::operator[](pQVar9,lVar12);
      QList<Field_*>::operator[](pQVar4,0);
      QAbstractButton::text();
      iVar10 = 1;
      if (iVar3 != 1) {
        lVar11 = 1;
        do {
          pQVar4 = QList<QList<Field_*>_>::operator[](pQVar9,lVar12);
          QList<Field_*>::operator[](pQVar4,lVar11);
          QAbstractButton::text();
          uVar5 = 0;
          if (local_48 == lStack_68) {
            QVar13.m_data = &pQStack_50->ucs;
            QVar13.m_size = local_48;
            QVar17.m_data = &pQStack_70->ucs;
            QVar17.m_size = local_48;
            iVar2 = QtPrivate::compareStrings(QVar13,QVar17,CaseSensitive);
            uVar5 = (uint)(iVar2 == 0);
          }
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,2,8);
            }
          }
          iVar10 = iVar10 + uVar5;
          lVar11 = lVar11 + 1;
        } while (lVar6 != lVar11);
      }
      if (iVar10 == iVar3) {
        pQVar8 = pQStack_70;
        if (pQStack_70 == (QChar *)0x0) {
          pQVar8 = (QChar *)&QString::_empty;
        }
        iVar10 = QString::compare_helper(pQVar8,lStack_68,"",-1,CaseSensitive);
        if (iVar10 != 0) goto LAB_00108ff3;
      }
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,2,8);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar6);
    if (0 < iVar3) {
      lVar12 = 0;
      do {
        pQVar4 = QList<QList<Field_*>_>::operator[](pQVar9,0);
        QList<Field_*>::operator[](pQVar4,lVar12);
        QAbstractButton::text();
        iVar10 = 1;
        if (iVar3 != 1) {
          lVar11 = 1;
          do {
            pQVar4 = QList<QList<Field_*>_>::operator[](pQVar9,lVar11);
            QList<Field_*>::operator[](pQVar4,lVar12);
            QAbstractButton::text();
            uVar5 = 0;
            if (local_48 == lStack_68) {
              QVar14.m_data = &pQStack_50->ucs;
              QVar14.m_size = local_48;
              QVar18.m_data = &pQStack_70->ucs;
              QVar18.m_size = local_48;
              iVar2 = QtPrivate::compareStrings(QVar14,QVar18,CaseSensitive);
              uVar5 = (uint)(iVar2 == 0);
            }
            if (local_58 != (QArrayData *)0x0) {
              LOCK();
              (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_58,2,8);
              }
            }
            iVar10 = iVar10 + uVar5;
            lVar11 = lVar11 + 1;
          } while (lVar6 != lVar11);
        }
        if (iVar10 == iVar3) {
          pQVar8 = pQStack_70;
          if (pQStack_70 == (QChar *)0x0) {
            pQVar8 = (QChar *)&QString::_empty;
          }
          iVar10 = QString::compare_helper(pQVar8,lStack_68,"",-1,CaseSensitive);
          if (iVar10 != 0) {
LAB_00108ff3:
            if (local_78 != (QArrayData *)0x0) {
              LOCK();
              (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_78,2,8);
              }
            }
            return true;
          }
        }
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,2,8);
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar6);
    }
  }
  pQVar9 = &this->grid_;
  pQVar4 = QList<QList<Field_*>_>::operator[](pQVar9,0);
  QList<Field_*>::operator[](pQVar4,0);
  QAbstractButton::text();
  iVar10 = 1;
  if (1 < iVar3) {
    lVar12 = 1;
    do {
      pQVar4 = QList<QList<Field_*>_>::operator[](pQVar9,lVar12);
      QList<Field_*>::operator[](pQVar4,lVar12);
      QAbstractButton::text();
      uVar5 = 0;
      if (local_48 == lStack_68) {
        QVar15.m_data = &pQStack_50->ucs;
        QVar15.m_size = local_48;
        QVar19.m_data = &pQStack_70->ucs;
        QVar19.m_size = local_48;
        iVar2 = QtPrivate::compareStrings(QVar15,QVar19,CaseSensitive);
        uVar5 = (uint)(iVar2 == 0);
      }
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,8);
        }
      }
      iVar10 = iVar10 + uVar5;
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  if (iVar10 == iVar3) {
    pQVar8 = pQStack_70;
    if (pQStack_70 == (QChar *)0x0) {
      pQVar8 = (QChar *)&QString::_empty;
    }
    iVar10 = QString::compare_helper(pQVar8,lStack_68,"",-1,CaseSensitive);
    bVar7 = true;
    if (iVar10 != 0) goto LAB_00108fd0;
  }
  pQVar4 = QList<QList<Field_*>_>::operator[](pQVar9,lVar6 + -1);
  QList<Field_*>::operator[](pQVar4,0);
  QAbstractButton::text();
  local_78 = local_58;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  iVar10 = 1;
  if (1 < iVar3) {
    i = (ulong)(iVar3 - 2);
    lVar12 = 1;
    do {
      pQVar4 = QList<QList<Field_*>_>::operator[](pQVar9,i);
      QList<Field_*>::operator[](pQVar4,lVar12);
      QAbstractButton::text();
      uVar5 = 0;
      if (lStack_68 == local_48) {
        QVar16.m_data = &pQStack_70->ucs;
        QVar16.m_size = lStack_68;
        QVar20.m_data = &pQStack_50->ucs;
        QVar20.m_size = lStack_68;
        iVar2 = QtPrivate::compareStrings(QVar16,QVar20,CaseSensitive);
        uVar5 = (uint)(iVar2 == 0);
      }
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,8);
        }
      }
      iVar10 = iVar10 + uVar5;
      i = i - 1;
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  if (iVar10 == iVar3) {
    if (pQStack_50 == (QChar *)0x0) {
      pQStack_50 = (QChar *)&QString::_empty;
    }
    iVar3 = QString::compare_helper(pQStack_50,local_48,"",-1,CaseSensitive);
    bVar7 = true;
    if (iVar3 != 0) goto LAB_00108fd0;
  }
  bVar7 = false;
LAB_00108fd0:
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,8);
    }
  }
  return bVar7;
}

Assistant:

bool GameBoard::winConditionSatisfied()
{
    // Check horizontally
    int N = width_; //Our application only works with square maps
    for(int i = 0; i < N; i++)
    {
        int matches = 1; // first symbol matches itself
        QString symbol = grid_[i][0]->text(); //Check if field holds X, O or is blank
        for(int j = 1; j < N; j++)
        {
            if(grid_[i][j]->text() == symbol)
                matches++;
        }
        if(matches == N && symbol != "")
            return true;
    }

    //Check vertically
    for(int j = 0; j < N; j++)
    {
        int matches = 1; // first symbol matches itself
        QString symbol = grid_[0][j]->text(); //Check if field holds X, O or is blank
        for(int i = 1; i < N; i++)
        {
            if(grid_[i][j]->text() == symbol)
                matches++;
        }
        if(matches == N && symbol != "")
            return true;
    }

    //Check diagonally
    //First check top left to bottom right:
    QString symbol = grid_[0][0]->text();
    int matches = 1;
    for(int i = 1; i < N; i++)
    {
        if(grid_[i][i]->text() == symbol)
            matches++;
    }
    if(matches == N && symbol != "")
        return true;

    //check bottom left to top right
    matches = 1;
    symbol = grid_[N-1][0]->text();
    for(int i = N-2, j = 1; j < N; i--, j++)
    {
        if(grid_[i][j]->text() == symbol)
            matches++;
    }
    if(matches == N && symbol != "")
        return true;

    return false; // If none of the previous checks returned true, win condition is not satisfied
}